

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O0

void __thiscall sparse_tree::preprocess(sparse_tree *this)

{
  reference pvVar1;
  long in_RDI;
  int i_1;
  int ptr;
  int val;
  int i;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0xf0) = 1;
  for (local_c = 1; local_c < 0xe; local_c = local_c + 1) {
    *(int *)(in_RDI + 0xf0 + (long)local_c * 4) =
         *(int *)(in_RDI + 0xf0 + (long)(local_c + -1) * 4) << 1;
  }
  local_10 = 1;
  local_14 = 0;
  for (local_18 = 1; local_18 < (int)((uint)*(ushort *)(in_RDI + 0xa8) * 2); local_18 = local_18 + 1
      ) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_18);
    *pvVar1 = local_14 + -1;
    if (local_10 == local_18) {
      local_10 = local_10 << 1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x78),(long)local_18);
      *pvVar1 = local_14;
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void sparse_tree::preprocess(){
    // memorizing powers of 2
    p2[0] = 1;
    for (int i=1; i<maxSize; i++)
        p2[i] = p2[i-1]*2; 

    // memorizing all log(n) values
    int val = 1,ptr=0;
    for (int i=1; i<2*n; i++){
        logn[i] = ptr-1;
        if (val==i){
            val*=2;
            logn[i] = ptr;
            ptr++;
        }
    }          
}